

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_fwd_txfm_avx2.c
# Opt level: O0

void fdct8_avx2(__m256i *in,__m256i *out,int8_t bit,int col_num,int outstride)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  uint uVar38;
  int32_t *piVar39;
  undefined8 *puVar40;
  int in_ECX;
  char in_DL;
  long in_RSI;
  long in_RDI;
  int in_R8D;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  int col;
  __m256i v [8];
  __m256i u [8];
  __m256i rnding;
  __m256i cospi40;
  __m256i cospi24;
  __m256i cospi8;
  __m256i cospi56;
  __m256i cospi16;
  __m256i cospi48;
  __m256i cospim32;
  __m256i cospi32;
  int32_t *cospi;
  int local_1604;
  undefined8 local_1500;
  undefined8 uStack_14f8;
  undefined8 uStack_14f0;
  undefined8 uStack_14e8;
  undefined8 local_14e0;
  undefined8 uStack_14d8;
  undefined8 uStack_14d0;
  undefined8 uStack_14c8;
  undefined8 local_14c0;
  undefined8 uStack_14b8;
  undefined8 uStack_14b0;
  undefined8 uStack_14a8;
  undefined8 local_14a0;
  undefined8 uStack_1498;
  undefined8 uStack_1490;
  undefined8 uStack_1488;
  undefined8 uStack_270;
  undefined8 uStack_268;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 uStack_130;
  undefined8 uStack_128;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  undefined8 uStack_70;
  undefined8 uStack_68;
  
  piVar39 = cospi_arr((int)in_DL);
  uVar38 = piVar39[0x20];
  auVar1 = vpinsrd_avx(ZEXT416(uVar38),uVar38,1);
  auVar1 = vpinsrd_avx(auVar1,uVar38,2);
  auVar1 = vpinsrd_avx(auVar1,uVar38,3);
  auVar2 = vpinsrd_avx(ZEXT416(uVar38),uVar38,1);
  auVar2 = vpinsrd_avx(auVar2,uVar38,2);
  auVar2 = vpinsrd_avx(auVar2,uVar38,3);
  uStack_270 = auVar2._0_8_;
  uStack_268 = auVar2._8_8_;
  uVar38 = -piVar39[0x20];
  auVar2 = vpinsrd_avx(ZEXT416(uVar38),uVar38,1);
  auVar2 = vpinsrd_avx(auVar2,uVar38,2);
  auVar2 = vpinsrd_avx(auVar2,uVar38,3);
  auVar3 = vpinsrd_avx(ZEXT416(uVar38),uVar38,1);
  auVar3 = vpinsrd_avx(auVar3,uVar38,2);
  auVar3 = vpinsrd_avx(auVar3,uVar38,3);
  uStack_230 = auVar3._0_8_;
  uStack_228 = auVar3._8_8_;
  uVar38 = piVar39[0x30];
  auVar3 = vpinsrd_avx(ZEXT416(uVar38),uVar38,1);
  auVar3 = vpinsrd_avx(auVar3,uVar38,2);
  auVar3 = vpinsrd_avx(auVar3,uVar38,3);
  auVar4 = vpinsrd_avx(ZEXT416(uVar38),uVar38,1);
  auVar4 = vpinsrd_avx(auVar4,uVar38,2);
  auVar4 = vpinsrd_avx(auVar4,uVar38,3);
  uStack_1f0 = auVar4._0_8_;
  uStack_1e8 = auVar4._8_8_;
  uVar38 = piVar39[0x10];
  auVar4 = vpinsrd_avx(ZEXT416(uVar38),uVar38,1);
  auVar4 = vpinsrd_avx(auVar4,uVar38,2);
  auVar4 = vpinsrd_avx(auVar4,uVar38,3);
  auVar5 = vpinsrd_avx(ZEXT416(uVar38),uVar38,1);
  auVar5 = vpinsrd_avx(auVar5,uVar38,2);
  auVar5 = vpinsrd_avx(auVar5,uVar38,3);
  uStack_1b0 = auVar5._0_8_;
  uStack_1a8 = auVar5._8_8_;
  uVar38 = piVar39[0x38];
  auVar5 = vpinsrd_avx(ZEXT416(uVar38),uVar38,1);
  auVar5 = vpinsrd_avx(auVar5,uVar38,2);
  auVar5 = vpinsrd_avx(auVar5,uVar38,3);
  auVar6 = vpinsrd_avx(ZEXT416(uVar38),uVar38,1);
  auVar6 = vpinsrd_avx(auVar6,uVar38,2);
  auVar6 = vpinsrd_avx(auVar6,uVar38,3);
  uStack_170 = auVar6._0_8_;
  uStack_168 = auVar6._8_8_;
  uVar38 = piVar39[8];
  auVar6 = vpinsrd_avx(ZEXT416(uVar38),uVar38,1);
  auVar6 = vpinsrd_avx(auVar6,uVar38,2);
  auVar6 = vpinsrd_avx(auVar6,uVar38,3);
  auVar7 = vpinsrd_avx(ZEXT416(uVar38),uVar38,1);
  auVar7 = vpinsrd_avx(auVar7,uVar38,2);
  auVar7 = vpinsrd_avx(auVar7,uVar38,3);
  uStack_130 = auVar7._0_8_;
  uStack_128 = auVar7._8_8_;
  uVar38 = piVar39[0x18];
  auVar7 = vpinsrd_avx(ZEXT416(uVar38),uVar38,1);
  auVar7 = vpinsrd_avx(auVar7,uVar38,2);
  auVar7 = vpinsrd_avx(auVar7,uVar38,3);
  auVar8 = vpinsrd_avx(ZEXT416(uVar38),uVar38,1);
  auVar8 = vpinsrd_avx(auVar8,uVar38,2);
  auVar8 = vpinsrd_avx(auVar8,uVar38,3);
  uStack_f0 = auVar8._0_8_;
  uStack_e8 = auVar8._8_8_;
  uVar38 = piVar39[0x28];
  auVar8 = vpinsrd_avx(ZEXT416(uVar38),uVar38,1);
  auVar8 = vpinsrd_avx(auVar8,uVar38,2);
  auVar8 = vpinsrd_avx(auVar8,uVar38,3);
  auVar42 = vpinsrd_avx(ZEXT416(uVar38),uVar38,1);
  auVar42 = vpinsrd_avx(auVar42,uVar38,2);
  auVar42 = vpinsrd_avx(auVar42,uVar38,3);
  uStack_b0 = auVar42._0_8_;
  uStack_a8 = auVar42._8_8_;
  uVar38 = 1 << (in_DL - 1U & 0x1f);
  auVar42 = vpinsrd_avx(ZEXT416(uVar38),uVar38,1);
  auVar42 = vpinsrd_avx(auVar42,uVar38,2);
  auVar42 = vpinsrd_avx(auVar42,uVar38,3);
  auVar41 = vpinsrd_avx(ZEXT416(uVar38),uVar38,1);
  auVar41 = vpinsrd_avx(auVar41,uVar38,2);
  auVar41 = vpinsrd_avx(auVar41,uVar38,3);
  auVar41 = ZEXT116(0) * auVar42 + ZEXT116(1) * auVar41;
  auVar42 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar42;
  uStack_70 = auVar42._0_8_;
  uStack_68 = auVar42._8_8_;
  for (local_1604 = 0; local_1604 < in_ECX; local_1604 = local_1604 + 1) {
    auVar9 = vpaddd_avx2(*(undefined1 (*) [32])(in_RDI + (long)local_1604 * 0x20),
                         *(undefined1 (*) [32])(in_RDI + (long)(in_ECX * 7 + local_1604) * 0x20));
    auVar15 = vpsubd_avx2(*(undefined1 (*) [32])(in_RDI + (long)local_1604 * 0x20),
                          *(undefined1 (*) [32])(in_RDI + (long)(in_ECX * 7 + local_1604) * 0x20));
    auVar10 = vpaddd_avx2(*(undefined1 (*) [32])(in_RDI + (long)(in_ECX + local_1604) * 0x20),
                          *(undefined1 (*) [32])(in_RDI + (long)(in_ECX * 6 + local_1604) * 0x20));
    auVar16 = vpsubd_avx2(*(undefined1 (*) [32])(in_RDI + (long)(in_ECX + local_1604) * 0x20),
                          *(undefined1 (*) [32])(in_RDI + (long)(in_ECX * 6 + local_1604) * 0x20));
    auVar11 = vpaddd_avx2(*(undefined1 (*) [32])(in_RDI + (long)(in_ECX * 2 + local_1604) * 0x20),
                          *(undefined1 (*) [32])(in_RDI + (long)(in_ECX * 5 + local_1604) * 0x20));
    auVar17 = vpsubd_avx2(*(undefined1 (*) [32])(in_RDI + (long)(in_ECX * 2 + local_1604) * 0x20),
                          *(undefined1 (*) [32])(in_RDI + (long)(in_ECX * 5 + local_1604) * 0x20));
    auVar12 = vpaddd_avx2(*(undefined1 (*) [32])(in_RDI + (long)(in_ECX * 3 + local_1604) * 0x20),
                          *(undefined1 (*) [32])(in_RDI + (long)(in_ECX * 4 + local_1604) * 0x20));
    auVar18 = vpsubd_avx2(*(undefined1 (*) [32])(in_RDI + (long)(in_ECX * 3 + local_1604) * 0x20),
                          *(undefined1 (*) [32])(in_RDI + (long)(in_ECX * 4 + local_1604) * 0x20));
    auVar13 = vpaddd_avx2(auVar9,auVar12);
    auVar19 = vpsubd_avx2(auVar9,auVar12);
    auVar9 = vpaddd_avx2(auVar10,auVar11);
    auVar20 = vpsubd_avx2(auVar10,auVar11);
    auVar37._16_8_ = uStack_230;
    auVar37._0_16_ = auVar2;
    auVar37._24_8_ = uStack_228;
    auVar10 = vpmulld_avx2(auVar17,auVar37);
    auVar36._16_8_ = uStack_270;
    auVar36._0_16_ = auVar1;
    auVar36._24_8_ = uStack_268;
    auVar11 = vpmulld_avx2(auVar16,auVar36);
    auVar10 = vpaddd_avx2(auVar10,auVar11);
    auVar22._16_8_ = uStack_70;
    auVar22._0_16_ = auVar41;
    auVar22._24_8_ = uStack_68;
    auVar10 = vpaddd_avx2(auVar10,auVar22);
    auVar12 = vpsrad_avx2(auVar10,ZEXT416((uint)(int)in_DL));
    auVar35._16_8_ = uStack_270;
    auVar35._0_16_ = auVar1;
    auVar35._24_8_ = uStack_268;
    auVar10 = vpmulld_avx2(auVar17,auVar35);
    auVar34._16_8_ = uStack_230;
    auVar34._0_16_ = auVar2;
    auVar34._24_8_ = uStack_228;
    auVar11 = vpmulld_avx2(auVar16,auVar34);
    auVar10 = vpsubd_avx2(auVar10,auVar11);
    auVar21._16_8_ = uStack_70;
    auVar21._0_16_ = auVar41;
    auVar21._24_8_ = uStack_68;
    auVar10 = vpaddd_avx2(auVar10,auVar21);
    auVar16 = vpsrad_avx2(auVar10,ZEXT416((uint)(int)in_DL));
    auVar33._16_8_ = uStack_270;
    auVar33._0_16_ = auVar1;
    auVar33._24_8_ = uStack_268;
    auVar10 = vpmulld_avx2(auVar13,auVar33);
    auVar32._16_8_ = uStack_270;
    auVar32._0_16_ = auVar1;
    auVar32._24_8_ = uStack_268;
    auVar11 = vpmulld_avx2(auVar9,auVar32);
    auVar9 = vpaddd_avx2(auVar10,auVar11);
    auVar13._16_8_ = uStack_70;
    auVar13._0_16_ = auVar41;
    auVar13._24_8_ = uStack_68;
    auVar9 = vpaddd_avx2(auVar9,auVar13);
    auVar13 = vpsrad_avx2(auVar9,ZEXT416((uint)(int)in_DL));
    auVar9 = vpsubd_avx2(auVar10,auVar11);
    auVar17._16_8_ = uStack_70;
    auVar17._0_16_ = auVar41;
    auVar17._24_8_ = uStack_68;
    auVar9 = vpaddd_avx2(auVar9,auVar17);
    auVar17 = vpsrad_avx2(auVar9,ZEXT416((uint)(int)in_DL));
    auVar31._16_8_ = uStack_1f0;
    auVar31._0_16_ = auVar3;
    auVar31._24_8_ = uStack_1e8;
    auVar9 = vpmulld_avx2(auVar20,auVar31);
    auVar30._16_8_ = uStack_1b0;
    auVar30._0_16_ = auVar4;
    auVar30._24_8_ = uStack_1a8;
    auVar10 = vpmulld_avx2(auVar19,auVar30);
    auVar9 = vpaddd_avx2(auVar9,auVar10);
    auVar14._16_8_ = uStack_70;
    auVar14._0_16_ = auVar41;
    auVar14._24_8_ = uStack_68;
    auVar9 = vpaddd_avx2(auVar9,auVar14);
    auVar14 = vpsrad_avx2(auVar9,ZEXT416((uint)(int)in_DL));
    auVar29._16_8_ = uStack_1b0;
    auVar29._0_16_ = auVar4;
    auVar29._24_8_ = uStack_1a8;
    auVar9 = vpmulld_avx2(auVar20,auVar29);
    auVar20._16_8_ = uStack_1f0;
    auVar20._0_16_ = auVar3;
    auVar20._24_8_ = uStack_1e8;
    auVar10 = vpmulld_avx2(auVar19,auVar20);
    auVar9 = vpsubd_avx2(auVar10,auVar9);
    auVar19._16_8_ = uStack_70;
    auVar19._0_16_ = auVar41;
    auVar19._24_8_ = uStack_68;
    auVar9 = vpaddd_avx2(auVar9,auVar19);
    auVar19 = vpsrad_avx2(auVar9,ZEXT416((uint)(int)in_DL));
    auVar9 = vpaddd_avx2(auVar18,auVar12);
    auVar18 = vpsubd_avx2(auVar18,auVar12);
    auVar20 = vpsubd_avx2(auVar15,auVar16);
    auVar10 = vpaddd_avx2(auVar15,auVar16);
    auVar28._16_8_ = uStack_170;
    auVar28._0_16_ = auVar5;
    auVar28._24_8_ = uStack_168;
    auVar11 = vpmulld_avx2(auVar9,auVar28);
    auVar27._16_8_ = uStack_130;
    auVar27._0_16_ = auVar6;
    auVar27._24_8_ = uStack_128;
    auVar12 = vpmulld_avx2(auVar10,auVar27);
    auVar11 = vpaddd_avx2(auVar11,auVar12);
    auVar16._16_8_ = uStack_70;
    auVar16._0_16_ = auVar41;
    auVar16._24_8_ = uStack_68;
    auVar11 = vpaddd_avx2(auVar11,auVar16);
    auVar11 = vpsrad_avx2(auVar11,ZEXT416((uint)(int)in_DL));
    *(undefined1 (*) [32])(in_RSI + (long)(in_R8D + local_1604) * 0x20) = auVar11;
    auVar26._16_8_ = uStack_130;
    auVar26._0_16_ = auVar6;
    auVar26._24_8_ = uStack_128;
    auVar9 = vpmulld_avx2(auVar9,auVar26);
    auVar25._16_8_ = uStack_170;
    auVar25._0_16_ = auVar5;
    auVar25._24_8_ = uStack_168;
    auVar10 = vpmulld_avx2(auVar10,auVar25);
    auVar9 = vpsubd_avx2(auVar10,auVar9);
    auVar12._16_8_ = uStack_70;
    auVar12._0_16_ = auVar41;
    auVar12._24_8_ = uStack_68;
    auVar9 = vpaddd_avx2(auVar9,auVar12);
    auVar9 = vpsrad_avx2(auVar9,ZEXT416((uint)(int)in_DL));
    *(undefined1 (*) [32])(in_RSI + (long)(in_R8D * 7 + local_1604) * 0x20) = auVar9;
    auVar24._16_8_ = uStack_f0;
    auVar24._0_16_ = auVar7;
    auVar24._24_8_ = uStack_e8;
    auVar9 = vpmulld_avx2(auVar18,auVar24);
    auVar23._16_8_ = uStack_b0;
    auVar23._0_16_ = auVar8;
    auVar23._24_8_ = uStack_a8;
    auVar10 = vpmulld_avx2(auVar20,auVar23);
    auVar9 = vpaddd_avx2(auVar9,auVar10);
    auVar11._16_8_ = uStack_70;
    auVar11._0_16_ = auVar41;
    auVar11._24_8_ = uStack_68;
    auVar9 = vpaddd_avx2(auVar9,auVar11);
    auVar9 = vpsrad_avx2(auVar9,ZEXT416((uint)(int)in_DL));
    *(undefined1 (*) [32])(in_RSI + (long)(in_R8D * 5 + local_1604) * 0x20) = auVar9;
    auVar9._16_8_ = uStack_b0;
    auVar9._0_16_ = auVar8;
    auVar9._24_8_ = uStack_a8;
    auVar9 = vpmulld_avx2(auVar18,auVar9);
    auVar15._16_8_ = uStack_f0;
    auVar15._0_16_ = auVar7;
    auVar15._24_8_ = uStack_e8;
    auVar10 = vpmulld_avx2(auVar20,auVar15);
    auVar9 = vpsubd_avx2(auVar10,auVar9);
    auVar10._16_8_ = uStack_70;
    auVar10._0_16_ = auVar41;
    auVar10._24_8_ = uStack_68;
    auVar9 = vpaddd_avx2(auVar9,auVar10);
    auVar9 = vpsrad_avx2(auVar9,ZEXT416((uint)(int)in_DL));
    *(undefined1 (*) [32])(in_RSI + (long)(in_R8D * 3 + local_1604) * 0x20) = auVar9;
    local_1500 = auVar13._0_8_;
    uStack_14f8 = auVar13._8_8_;
    uStack_14f0 = auVar13._16_8_;
    uStack_14e8 = auVar13._24_8_;
    puVar40 = (undefined8 *)(in_RSI + (long)local_1604 * 0x20);
    *puVar40 = local_1500;
    puVar40[1] = uStack_14f8;
    puVar40[2] = uStack_14f0;
    puVar40[3] = uStack_14e8;
    local_14e0 = auVar17._0_8_;
    uStack_14d8 = auVar17._8_8_;
    uStack_14d0 = auVar17._16_8_;
    uStack_14c8 = auVar17._24_8_;
    puVar40 = (undefined8 *)(in_RSI + (long)(in_R8D * 4 + local_1604) * 0x20);
    *puVar40 = local_14e0;
    puVar40[1] = uStack_14d8;
    puVar40[2] = uStack_14d0;
    puVar40[3] = uStack_14c8;
    local_14c0 = auVar14._0_8_;
    uStack_14b8 = auVar14._8_8_;
    uStack_14b0 = auVar14._16_8_;
    uStack_14a8 = auVar14._24_8_;
    puVar40 = (undefined8 *)(in_RSI + (long)(in_R8D * 2 + local_1604) * 0x20);
    *puVar40 = local_14c0;
    puVar40[1] = uStack_14b8;
    puVar40[2] = uStack_14b0;
    puVar40[3] = uStack_14a8;
    local_14a0 = auVar19._0_8_;
    uStack_1498 = auVar19._8_8_;
    uStack_1490 = auVar19._16_8_;
    uStack_1488 = auVar19._24_8_;
    puVar40 = (undefined8 *)(in_RSI + (long)(in_R8D * 6 + local_1604) * 0x20);
    *puVar40 = local_14a0;
    puVar40[1] = uStack_1498;
    puVar40[2] = uStack_1490;
    puVar40[3] = uStack_1488;
  }
  return;
}

Assistant:

static void fdct8_avx2(__m256i *in, __m256i *out, const int8_t bit,
                       const int col_num, const int outstride) {
  const int32_t *cospi = cospi_arr(bit);
  const __m256i cospi32 = _mm256_set1_epi32(cospi[32]);
  const __m256i cospim32 = _mm256_set1_epi32(-cospi[32]);
  const __m256i cospi48 = _mm256_set1_epi32(cospi[48]);
  const __m256i cospi16 = _mm256_set1_epi32(cospi[16]);
  const __m256i cospi56 = _mm256_set1_epi32(cospi[56]);
  const __m256i cospi8 = _mm256_set1_epi32(cospi[8]);
  const __m256i cospi24 = _mm256_set1_epi32(cospi[24]);
  const __m256i cospi40 = _mm256_set1_epi32(cospi[40]);
  const __m256i rnding = _mm256_set1_epi32(1 << (bit - 1));
  __m256i u[8], v[8];
  for (int col = 0; col < col_num; ++col) {
    u[0] = _mm256_add_epi32(in[0 * col_num + col], in[7 * col_num + col]);
    v[7] = _mm256_sub_epi32(in[0 * col_num + col], in[7 * col_num + col]);
    u[1] = _mm256_add_epi32(in[1 * col_num + col], in[6 * col_num + col]);
    u[6] = _mm256_sub_epi32(in[1 * col_num + col], in[6 * col_num + col]);
    u[2] = _mm256_add_epi32(in[2 * col_num + col], in[5 * col_num + col]);
    u[5] = _mm256_sub_epi32(in[2 * col_num + col], in[5 * col_num + col]);
    u[3] = _mm256_add_epi32(in[3 * col_num + col], in[4 * col_num + col]);
    v[4] = _mm256_sub_epi32(in[3 * col_num + col], in[4 * col_num + col]);
    v[0] = _mm256_add_epi32(u[0], u[3]);
    v[3] = _mm256_sub_epi32(u[0], u[3]);
    v[1] = _mm256_add_epi32(u[1], u[2]);
    v[2] = _mm256_sub_epi32(u[1], u[2]);

    v[5] = _mm256_mullo_epi32(u[5], cospim32);
    v[6] = _mm256_mullo_epi32(u[6], cospi32);
    v[5] = _mm256_add_epi32(v[5], v[6]);
    v[5] = _mm256_add_epi32(v[5], rnding);
    v[5] = _mm256_srai_epi32(v[5], bit);

    u[0] = _mm256_mullo_epi32(u[5], cospi32);
    v[6] = _mm256_mullo_epi32(u[6], cospim32);
    v[6] = _mm256_sub_epi32(u[0], v[6]);
    v[6] = _mm256_add_epi32(v[6], rnding);
    v[6] = _mm256_srai_epi32(v[6], bit);

    // stage 3
    // type 0
    v[0] = _mm256_mullo_epi32(v[0], cospi32);
    v[1] = _mm256_mullo_epi32(v[1], cospi32);
    u[0] = _mm256_add_epi32(v[0], v[1]);
    u[0] = _mm256_add_epi32(u[0], rnding);
    u[0] = _mm256_srai_epi32(u[0], bit);

    u[1] = _mm256_sub_epi32(v[0], v[1]);
    u[1] = _mm256_add_epi32(u[1], rnding);
    u[1] = _mm256_srai_epi32(u[1], bit);

    // type 1
    v[0] = _mm256_mullo_epi32(v[2], cospi48);
    v[1] = _mm256_mullo_epi32(v[3], cospi16);
    u[2] = _mm256_add_epi32(v[0], v[1]);
    u[2] = _mm256_add_epi32(u[2], rnding);
    u[2] = _mm256_srai_epi32(u[2], bit);

    v[0] = _mm256_mullo_epi32(v[2], cospi16);
    v[1] = _mm256_mullo_epi32(v[3], cospi48);
    u[3] = _mm256_sub_epi32(v[1], v[0]);
    u[3] = _mm256_add_epi32(u[3], rnding);
    u[3] = _mm256_srai_epi32(u[3], bit);

    u[4] = _mm256_add_epi32(v[4], v[5]);
    u[5] = _mm256_sub_epi32(v[4], v[5]);
    u[6] = _mm256_sub_epi32(v[7], v[6]);
    u[7] = _mm256_add_epi32(v[7], v[6]);

    // stage 4
    // stage 5
    v[0] = _mm256_mullo_epi32(u[4], cospi56);
    v[1] = _mm256_mullo_epi32(u[7], cospi8);
    v[0] = _mm256_add_epi32(v[0], v[1]);
    v[0] = _mm256_add_epi32(v[0], rnding);
    out[1 * outstride + col] = _mm256_srai_epi32(v[0], bit);  // buf0[4]

    v[0] = _mm256_mullo_epi32(u[4], cospi8);
    v[1] = _mm256_mullo_epi32(u[7], cospi56);
    v[0] = _mm256_sub_epi32(v[1], v[0]);
    v[0] = _mm256_add_epi32(v[0], rnding);
    out[7 * outstride + col] = _mm256_srai_epi32(v[0], bit);  // buf0[7]

    v[0] = _mm256_mullo_epi32(u[5], cospi24);
    v[1] = _mm256_mullo_epi32(u[6], cospi40);
    v[0] = _mm256_add_epi32(v[0], v[1]);
    v[0] = _mm256_add_epi32(v[0], rnding);
    out[5 * outstride + col] = _mm256_srai_epi32(v[0], bit);  // buf0[5]

    v[0] = _mm256_mullo_epi32(u[5], cospi40);
    v[1] = _mm256_mullo_epi32(u[6], cospi24);
    v[0] = _mm256_sub_epi32(v[1], v[0]);
    v[0] = _mm256_add_epi32(v[0], rnding);
    out[3 * outstride + col] = _mm256_srai_epi32(v[0], bit);  // buf0[6]

    out[0 * outstride + col] = u[0];  // buf0[0]
    out[4 * outstride + col] = u[1];  // buf0[1]
    out[2 * outstride + col] = u[2];  // buf0[2]
    out[6 * outstride + col] = u[3];  // buf0[3]
  }
}